

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_dec_ref_pic_marking(h264_stream_t *h,bs_t *b)

{
  int iVar1;
  slice_header_t *psVar2;
  uint32_t uVar3;
  int *piVar4;
  
  psVar2 = h->sh;
  iVar1 = h->nal->nal_unit_type;
  uVar3 = bs_read_u1(b);
  if (iVar1 == 5) {
    (psVar2->drpm).no_output_of_prior_pics_flag = uVar3;
    uVar3 = bs_read_u1(b);
    (psVar2->drpm).long_term_reference_flag = uVar3;
  }
  else {
    (psVar2->drpm).adaptive_ref_pic_marking_mode_flag = uVar3;
    if (uVar3 != 0) {
      piVar4 = (psVar2->drpm).memory_management_control_operation;
      do {
        uVar3 = bs_read_ue(b);
        *piVar4 = uVar3;
        if ((uVar3 | 2) == 3) {
          uVar3 = bs_read_ue(b);
          piVar4[0x40] = uVar3;
          uVar3 = *piVar4;
        }
        if (uVar3 == 2) {
          uVar3 = bs_read_ue(b);
          piVar4[0x80] = uVar3;
          uVar3 = *piVar4;
        }
        if ((uVar3 == 6) || (uVar3 == 3)) {
          uVar3 = bs_read_ue(b);
          piVar4[0xc0] = uVar3;
          uVar3 = *piVar4;
        }
        if (uVar3 == 4) {
          uVar3 = bs_read_ue(b);
          piVar4[0x100] = uVar3;
          uVar3 = *piVar4;
        }
      } while ((uVar3 != 0) && (piVar4 = piVar4 + 1, b->p < b->end));
    }
  }
  return;
}

Assistant:

void read_dec_ref_pic_marking(h264_stream_t* h, bs_t* b)
{
    slice_header_t* sh = h->sh;
    // FIXME should be an array

    if( h->nal->nal_unit_type == 5 )
    {
        sh->drpm.no_output_of_prior_pics_flag = bs_read_u1(b);
        sh->drpm.long_term_reference_flag = bs_read_u1(b);
    }
    else
    {
        sh->drpm.adaptive_ref_pic_marking_mode_flag = bs_read_u1(b);
        if( sh->drpm.adaptive_ref_pic_marking_mode_flag )
        {
            int n = -1;
            do
            {
                n++;
                sh->drpm.memory_management_control_operation[ n ] = bs_read_ue(b);
                if( sh->drpm.memory_management_control_operation[ n ] == 1 ||
                    sh->drpm.memory_management_control_operation[ n ] == 3 )
                {
                    sh->drpm.difference_of_pic_nums_minus1[ n ] = bs_read_ue(b);
                }
                if(sh->drpm.memory_management_control_operation[ n ] == 2 )
                {
                    sh->drpm.long_term_pic_num[ n ] = bs_read_ue(b);
                }
                if( sh->drpm.memory_management_control_operation[ n ] == 3 ||
                    sh->drpm.memory_management_control_operation[ n ] == 6 )
                {
                    sh->drpm.long_term_frame_idx[ n ] = bs_read_ue(b);
                }
                if( sh->drpm.memory_management_control_operation[ n ] == 4 )
                {
                    sh->drpm.max_long_term_frame_idx_plus1[ n ] = bs_read_ue(b);
                }
            } while( sh->drpm.memory_management_control_operation[ n ] != 0 && ! bs_eof(b) );
        }
    }
}